

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,uint64_t *a)

{
  string *this_00;
  char *__nptr;
  ulonglong *in_RDX;
  char in_SIL;
  long in_RDI;
  char *str;
  ulonglong local_60;
  allocator local_19;
  ulonglong *local_18;
  
  if (in_SIL != '8') {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,"Could not read message. Expected different type, got uint64_t",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_18 = in_RDX;
  __nptr = zmsg_popstr(*(zmsg_t **)(in_RDI + 0x20));
  if (__nptr == (char *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = strtoull(__nptr,(char **)0x0,10);
  }
  *local_18 = local_60;
  free(__nptr);
  return;
}

Assistant:

void TrodesMsg::processArg(const char c, uint64_t &a){
    if(c != '8') throw std::string(PROCESSERROR "uint64_t");
    char *str = zmsg_popstr(msg);
    a = str ? (uint64_t) strtoull(str, NULL, 10) : 0;
    freen(str);
}